

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::adjust_precision(int *precision,int exp10)

{
  int iVar1;
  int iVar2;
  format_error *this;
  int exp10_local;
  int *precision_local;
  
  if (0 < exp10) {
    iVar1 = *precision;
    iVar2 = max_value<int>();
    if (iVar2 - exp10 < iVar1) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::runtime_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
  }
  *precision = exp10 + *precision;
  return;
}

Assistant:

inline FMT_CONSTEXPR20 void adjust_precision(int& precision, int exp10) {
  // Adjust fixed precision by exponent because it is relative to decimal
  // point.
  if (exp10 > 0 && precision > max_value<int>() - exp10)
    FMT_THROW(format_error("number is too big"));
  precision += exp10;
}